

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ShaderTextureFunctionCase::deinit(ShaderTextureFunctionCase *this)

{
  TextureCube *this_00;
  Texture2DArray *this_01;
  Texture3D *this_02;
  
  deqp::gls::ShaderRenderCase::deinit(&this->super_ShaderRenderCase);
  if (this->m_texture2D != (Texture2D *)0x0) {
    (*this->m_texture2D->_vptr_Texture2D[1])();
  }
  this_00 = this->m_textureCube;
  if (this_00 != (TextureCube *)0x0) {
    glu::TextureCube::~TextureCube(this_00);
    operator_delete(this_00,0x180);
  }
  this_01 = this->m_texture2DArray;
  if (this_01 != (Texture2DArray *)0x0) {
    glu::Texture2DArray::~Texture2DArray(this_01);
    operator_delete(this_01,0x70);
  }
  this_02 = this->m_texture3D;
  if (this_02 != (Texture3D *)0x0) {
    glu::Texture3D::~Texture3D(this_02);
    operator_delete(this_02,0x70);
  }
  this->m_texture2DArray = (Texture2DArray *)0x0;
  this->m_texture3D = (Texture3D *)0x0;
  this->m_texture2D = (Texture2D *)0x0;
  this->m_textureCube = (TextureCube *)0x0;
  return;
}

Assistant:

void ShaderTextureFunctionCase::deinit (void)
{
	gls::ShaderRenderCase::deinit();

	delete m_texture2D;
	delete m_textureCube;
	delete m_texture2DArray;
	delete m_texture3D;

	m_texture2D			= DE_NULL;
	m_textureCube		= DE_NULL;
	m_texture2DArray	= DE_NULL;
	m_texture3D			= DE_NULL;
}